

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_state_prepare_transfer(connectdata *conn)

{
  Curl_easy *pCVar1;
  CURLcode CVar2;
  char *pcVar3;
  char *fmt;
  
  pCVar1 = conn->data;
  if (*(int *)((long)(pCVar1->req).protop + 0x18) != 0) {
    (conn->proto).ftpc.state = FTP_RETR_PREQUOTE;
    CVar2 = ftp_state_quote(conn,true,FTP_RETR_PREQUOTE);
    return CVar2;
  }
  if ((pCVar1->set).ftp_use_port == true) {
    CVar2 = ftp_state_use_port(conn,EPRT);
    return CVar2;
  }
  if ((pCVar1->set).ftp_use_pret == true) {
    pcVar3 = (conn->proto).ftpc.file;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (pCVar1->set).str[6];
      if (pcVar3 == (char *)0x0) {
        pcVar3 = "LIST";
        if ((pCVar1->set).ftp_list_only != false) {
          pcVar3 = "NLST";
        }
      }
      fmt = "PRET %s";
    }
    else if ((pCVar1->set).upload == true) {
      fmt = "PRET STOR %s";
    }
    else {
      fmt = "PRET RETR %s";
    }
    CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,fmt,pcVar3);
    if (CVar2 == CURLE_OK) {
      (conn->proto).ftpc.state = FTP_PRET;
      CVar2 = CURLE_OK;
    }
    return CVar2;
  }
  CVar2 = ftp_state_use_pasv(conn);
  return CVar2;
}

Assistant:

static CURLcode ftp_state_prepare_transfer(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = conn->data->req.protop;
  struct Curl_easy *data = conn->data;

  if(ftp->transfer != FTPTRANSFER_BODY) {
    /* doesn't transfer any data */

    /* still possibly do PRE QUOTE jobs */
    state(conn, FTP_RETR_PREQUOTE);
    result = ftp_state_quote(conn, TRUE, FTP_RETR_PREQUOTE);
  }
  else if(data->set.ftp_use_port) {
    /* We have chosen to use the PORT (or similar) command */
    result = ftp_state_use_port(conn, EPRT);
  }
  else {
    /* We have chosen (this is default) to use the PASV (or similar) command */
    if(data->set.ftp_use_pret) {
      /* The user has requested that we send a PRET command
         to prepare the server for the upcoming PASV */
      if(!conn->proto.ftpc.file) {
        PPSENDF(&conn->proto.ftpc.pp, "PRET %s",
                data->set.str[STRING_CUSTOMREQUEST]?
                data->set.str[STRING_CUSTOMREQUEST]:
                (data->set.ftp_list_only?"NLST":"LIST"));
      }
      else if(data->set.upload) {
        PPSENDF(&conn->proto.ftpc.pp, "PRET STOR %s", conn->proto.ftpc.file);
      }
      else {
        PPSENDF(&conn->proto.ftpc.pp, "PRET RETR %s", conn->proto.ftpc.file);
      }
      state(conn, FTP_PRET);
    }
    else {
      result = ftp_state_use_pasv(conn);
    }
  }
  return result;
}